

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void __thiscall
Test_TemplateModifiers_JavascriptEscape::Test_TemplateModifiers_JavascriptEscape
          (Test_TemplateModifiers_JavascriptEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(TemplateModifiers, JavascriptEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestJavascriptEscape", NULL);
  dict.SetEscapedValue("easy JS", "joo",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("harder JS", "f = 'joo';",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("hardest JS",
                       ("f = 'foo\f';\r\n\tprint \"\\&foo = \b\", \"foo\""),
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("close script JS",
                       "//--></script><script>alert(123);</script>",
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("unicode codepoints",
                       ("line1" "\xe2\x80\xa8" "line2" "\xe2\x80\xa9" "line3"
                        /* \u2027 */ "\xe2\x80\xa7"
                        /* \u202A */ "\xe2\x80\xaa"
                        /* malformed */ "\xe2" "\xe2\x80\xa8"
                        /* truncated */ "\xe2\x80"),
                       GOOGLE_NAMESPACE::javascript_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy JS"), "joo");
  EXPECT_STREQ(peer.GetSectionValue("harder JS"), "f \\x3d \\x27joo\\x27;");
  EXPECT_STREQ(peer.GetSectionValue("hardest JS"),
               "f \\x3d \\x27foo\\f\\x27;\\r\\n\\tprint \\x22\\\\\\x26foo "
               "\\x3d \\b\\x22, \\x22foo\\x22");
  EXPECT_STREQ(peer.GetSectionValue("close script JS"),
               "//--\\x3e\\x3c/script\\x3e\\x3cscript\\x3e"
               "alert(123);\\x3c/script\\x3e");
  EXPECT_STREQ(peer.GetSectionValue("unicode codepoints"),
               "line1" "\\u2028" "line2" "\\u2029" "line3"
               "\xe2\x80\xa7"
               "\xe2\x80\xaa"
               "\xe2" "\\u2028"
               "\xe2\x80");
}